

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O2

void TPZShapeHDivConstantBound<pzshape::TPZShapeQuad>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  long columns;
  long col;
  TPZVec<double> qsi;
  TPZFMatrix<double> curlPhiAux;
  TPZFMatrix<double> phiAux;
  
  pztopology::TPZQuadrilateral::NumSides(1);
  TPZShapeH1<pzshape::TPZShapeQuad>::Shape(pt,data);
  iVar2 = *(data->fSideOrient).super_TPZVec<int>.fStore;
  pdVar4 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar4 = (double)iVar2 * 0.25;
  iVar2 = TPZShapeHCurlNoGrads<pzshape::TPZShapeQuad>::NHCurlShapeF(data);
  columns = (long)iVar2;
  TPZFMatrix<double>::TPZFMatrix(&phiAux,2,columns);
  TPZFMatrix<double>::TPZFMatrix(&curlPhiAux,1,columns);
  memset(curlPhiAux.fElem,0,
         curlPhiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         curlPhiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  curlPhiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  TPZVec<double>::TPZVec(&qsi,pt);
  TPZShapeHCurlNoGrads<pzshape::TPZShapeQuad>::Shape(&qsi,data,&phiAux,&curlPhiAux);
  iVar2 = 1;
  iVar3 = pztopology::TPZQuadrilateral::NumSides(1);
  for (col = (long)iVar3; col < columns; col = col + 1) {
    pdVar4 = TPZFMatrix<double>::operator()(&curlPhiAux,0,col);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(phi,(long)iVar2,0);
    *pdVar4 = dVar1;
    iVar2 = iVar2 + 1;
  }
  TPZVec<double>::~TPZVec(&qsi);
  TPZFMatrix<double>::~TPZFMatrix(&curlPhiAux);
  TPZFMatrix<double>::~TPZFMatrix(&phiAux);
  return;
}

Assistant:

void TPZShapeHDivConstantBound<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi) {

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const auto nEdges = TSHAPE::NumSides(1);
    TPZShapeH1<TSHAPE>::Shape(pt,data);

    if (dim == 1){
        phi(0,0) = 0.5 * data.fSideOrient[0];

        int nshape = data.fPhi.Rows();

        for (int i = 0; i < nshape-ncorner; i++){
            phi(i+1,0) = -data.fDPhi(0,i+ncorner);
        }
    } else if (dim == 2) {
        
        
        if (TSHAPE::Type() == EQuadrilateral){
            phi(0,0) = 0.25 * data.fSideOrient[0];
        } else if (TSHAPE::Type() == ETriangle){
            phi(0,0) = 2. * data.fSideOrient[0];
        }

        int nshape = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);

        TPZFMatrix<REAL> phiAux(2,nshape),curlPhiAux(1,nshape);
        curlPhiAux.Zero();
        auto qsi = pt;
        TPZShapeHCurlNoGrads<TSHAPE>::Shape(qsi,data,phiAux,curlPhiAux);

        auto nEdges = TSHAPE::NumSides(1); 
       
        for (int i = nEdges; i < nshape; i++)
        {
            phi(i-nEdges+1,0) = curlPhiAux(0,i);
        }
        
    } else {
        DebugStop();
    }


}